

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O1

void * v2i_issuer_alt(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  size_t sVar3;
  X509_EXTENSION *ext;
  OPENSSL_STACK *sk_00;
  void *pvVar4;
  size_t sVar5;
  char *method_00;
  bool bVar6;
  
  sk = OPENSSL_sk_new_null();
  if (sk != (OPENSSL_STACK *)0x0) {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar2 == 0) {
      return sk;
    }
    sVar2 = 0;
    do {
      cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar2);
      method_00 = "issuer";
      iVar1 = x509v3_conf_name_matches(cnf->name,"issuer");
      if ((iVar1 == 0) || (cnf->value == (char *)0x0)) {
LAB_002245a2:
        a = v2i_GENERAL_NAME_ex((GENERAL_NAME *)0x0,(X509V3_EXT_METHOD *)method_00,(X509V3_CTX *)ctx
                                ,cnf,0);
        if ((a == (GENERAL_NAME *)0x0) || (sVar3 = OPENSSL_sk_push(sk,a), sVar3 == 0)) {
          GENERAL_NAME_free(a);
          iVar1 = 5;
          bVar6 = false;
        }
        else {
          iVar1 = 0;
          bVar6 = true;
        }
        if (bVar6) {
LAB_002245e3:
          iVar1 = 0;
        }
      }
      else {
        method_00 = "copy";
        iVar1 = strcmp(cnf->value,"copy");
        if (iVar1 != 0) goto LAB_002245a2;
        if (ctx != (X509V3_CTX *)0x0) {
          if (ctx->flags != 1) {
            if ((X509 *)ctx->issuer_cert == (X509 *)0x0) goto LAB_002246d5;
            iVar1 = X509_get_ext_by_NID((X509 *)ctx->issuer_cert,0x55,-1);
            if (iVar1 < 0) goto LAB_002245e3;
            ext = X509_get_ext((X509 *)ctx->issuer_cert,iVar1);
            if ((ext == (X509_EXTENSION *)0x0) ||
               (sk_00 = (OPENSSL_STACK *)X509V3_EXT_d2i(ext), sk_00 == (OPENSSL_STACK *)0x0)) {
              ERR_put_error(0x14,0,0x88,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                            ,0x115);
              GENERAL_NAMES_free((GENERAL_NAMES *)0x0);
              goto LAB_002246f3;
            }
            sVar3 = OPENSSL_sk_num(sk_00);
            bVar6 = sVar3 == 0;
            if (!bVar6) {
              pvVar4 = OPENSSL_sk_value(sk_00,0);
              sVar3 = OPENSSL_sk_push(sk,pvVar4);
              if (sVar3 != 0) {
                sVar3 = 0;
                do {
                  OPENSSL_sk_set(sk_00,sVar3,(void *)0x0);
                  sVar3 = sVar3 + 1;
                  sVar5 = OPENSSL_sk_num(sk_00);
                  bVar6 = sVar5 <= sVar3;
                  if (bVar6) break;
                  pvVar4 = OPENSSL_sk_value(sk_00,sVar3);
                  sVar5 = OPENSSL_sk_push(sk,pvVar4);
                } while (sVar5 != 0);
              }
            }
            GENERAL_NAMES_free((GENERAL_NAMES *)sk_00);
            iVar1 = 5;
            if (bVar6) goto LAB_002245e3;
            goto LAB_002245e5;
          }
          goto LAB_002245e3;
        }
LAB_002246d5:
        ERR_put_error(0x14,0,0x8d,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                      ,0x108);
LAB_002246f3:
        iVar1 = 5;
      }
LAB_002245e5:
      if (iVar1 != 0) goto LAB_00224750;
      sVar2 = sVar2 + 1;
      sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    } while (sVar2 < sVar3);
    iVar1 = 2;
LAB_00224750:
    if (iVar1 != 5) {
      return sk;
    }
    OPENSSL_sk_pop_free_ex(sk,sk_GENERAL_NAME_call_free_func,GENERAL_NAME_free);
  }
  return (void *)0x0;
}

Assistant:

static void *v2i_issuer_alt(const X509V3_EXT_METHOD *method,
                            const X509V3_CTX *ctx,
                            const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (x509v3_conf_name_matches(cnf->name, "issuer") && cnf->value &&
        !strcmp(cnf->value, "copy")) {
      if (!copy_issuer(ctx, gens)) {
        goto err;
      }
    } else {
      GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
      if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
        GENERAL_NAME_free(gen);
        goto err;
      }
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}